

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O2

ze_result_t loader::zesDriverGet(uint32_t *pCount,zes_driver_handle_t *phDrivers)

{
  _ze_driver_handle_t **_params;
  byte bVar1;
  uint uVar2;
  int iVar3;
  ze_result_t zVar4;
  long *plVar5;
  undefined8 *puVar6;
  object_t<_ze_driver_handle_t_*> *poVar7;
  undefined8 uVar8;
  driver_t *drv;
  long lVar9;
  long lVar10;
  uint32_t i;
  ulong uVar11;
  uint uVar12;
  pthread_once_t *__once_control;
  ulong uVar13;
  uint32_t library_driver_handle_count;
  uint local_5c;
  zes_driver_handle_t *local_58;
  long local_50;
  uint32_t *local_48;
  ulong local_40;
  dditable_t *local_38;
  
  LOCK();
  bVar1 = *(byte *)(context + 0x165c);
  *(byte *)(context + 0x165c) = 1;
  UNLOCK();
  lVar9 = context;
  local_58 = phDrivers;
  if (((bVar1 & 1) == 0) && (*(char *)(context + 0x165d) == '\0')) {
    __once_control = (pthread_once_t *)(context + 0x1658);
    local_38 = (dditable_t *)&stack0xffffffffffffffa4;
    plVar5 = (long *)__tls_get_addr(&PTR_0023fc60);
    *plVar5 = (long)&stack0xffffffffffffffc8;
    puVar6 = (undefined8 *)__tls_get_addr(&PTR_0023fd80);
    *puVar6 = std::once_flag::_Prepare_execution::
              _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
              ::anon_class_1_0_00000001::__invoke;
    iVar3 = pthread_once(__once_control,__once_proxy);
    if (iVar3 != 0) {
      uVar8 = std::__throw_system_error(iVar3);
      *plVar5 = 0;
      *puVar6 = 0;
      _Unwind_Resume(uVar8);
    }
    *plVar5 = 0;
    *puVar6 = 0;
    lVar9 = context;
    LOCK();
    *(undefined1 *)(context + 0x165c) = 0;
    UNLOCK();
  }
  lVar10 = (*(long **)(lVar9 + 0x1610))[1];
  uVar13 = 0;
  zVar4 = ZE_RESULT_SUCCESS;
  local_50 = lVar10;
  local_48 = pCount;
  for (lVar9 = **(long **)(lVar9 + 0x1610); uVar12 = (uint)uVar13, lVar9 != lVar10;
      lVar9 = lVar9 + 0xd98) {
    if (*(int *)(lVar9 + 0xc) == 0 && *(int *)(lVar9 + 8) == 0) {
      if ((*pCount != 0) && (*pCount == uVar12)) break;
      local_5c = 0;
      zVar4 = (**(code **)(lVar9 + 0x9f0))(&stack0xffffffffffffffa4,0);
      if (zVar4 == ZE_RESULT_SUCCESS) {
        if ((local_58 != (zes_driver_handle_t *)0x0) && (uVar2 = *pCount, uVar2 != 0)) {
          if (uVar2 < local_5c + uVar12) {
            local_5c = uVar2 - uVar12;
          }
          zVar4 = (**(code **)(lVar9 + 0x9f0))(&stack0xffffffffffffffa4);
          if (zVar4 != ZE_RESULT_SUCCESS) break;
          *(undefined1 *)(lVar9 + 0xd60) = 1;
          local_40 = uVar13;
          for (uVar11 = 0; lVar10 = local_50, pCount = local_48, uVar13 = local_40,
              uVar11 < local_5c; uVar11 = uVar11 + 1) {
            _params = local_58 + (uVar12 + (int)uVar11);
            local_38 = (dditable_t *)(lVar9 + 0x18);
            poVar7 = singleton_factory_t<object_t<_ze_driver_handle_t*>,_ze_driver_handle_t*>::
                     getInstance<_ze_driver_handle_t*&,dditable_t*>
                               ((singleton_factory_t<object_t<_ze_driver_handle_t*>,_ze_driver_handle_t*>
                                 *)(context + 0x8a0),_params,&stack0xffffffffffffffc8);
            *_params = (_ze_driver_handle_t *)poVar7;
          }
        }
        uVar13 = (ulong)((int)uVar13 + local_5c);
        zVar4 = ZE_RESULT_SUCCESS;
      }
      else if (zVar4 == ZE_RESULT_ERROR_UNINITIALIZED) {
        *(undefined4 *)(lVar9 + 8) = 0x78000001;
        zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
      }
    }
  }
  if (uVar12 != 0 || zVar4 == ZE_RESULT_SUCCESS) {
    *pCount = uVar12;
  }
  if (uVar12 != 0) {
    zVar4 = ZE_RESULT_SUCCESS;
  }
  return zVar4;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGet(
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sysman driver instances.
                                                        ///< if count is zero, then the loader shall update the value with the
                                                        ///< total number of sysman drivers available.
                                                        ///< if count is greater than the number of sysman drivers available, then
                                                        ///< the loader shall update the value with the correct number of sysman
                                                        ///< drivers available.
        zes_driver_handle_t* phDrivers                  ///< [in,out][optional][range(0, *pCount)] array of sysman driver instance handles.
                                                        ///< if count is less than the number of sysman drivers available, then the
                                                        ///< loader shall only retrieve that number of sysman drivers.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        uint32_t total_driver_handle_count = 0;

        if (!loader::context->sortingInProgress.exchange(true) && !loader::context->instrumentationEnabled) {
            std::call_once(loader::context->sysmanDriverSortOnce, []() {
                loader::context->driverSorting(loader::context->sysmanInstanceDrivers, nullptr, true);
            });
            loader::context->sortingInProgress.store(false);
        }

        for( auto& drv : *loader::context->sysmanInstanceDrivers )
        {
            if(drv.initStatus != ZE_RESULT_SUCCESS || drv.initSysManStatus != ZE_RESULT_SUCCESS)
                continue;

            if( ( 0 < *pCount ) && ( *pCount == total_driver_handle_count))
                break;

            uint32_t library_driver_handle_count = 0;

            result = drv.dditable.zes.Driver.pfnGet( &library_driver_handle_count, nullptr );
            if( ZE_RESULT_SUCCESS != result ) {
                // If Get Drivers fails with Uninitialized, then update the driver init status to prevent reporting this driver in the next get call.
                if (ZE_RESULT_ERROR_UNINITIALIZED == result) {
                    drv.initStatus = result;
                }
                continue;
            }

            if( nullptr != phDrivers && *pCount !=0)
            {
                if( total_driver_handle_count + library_driver_handle_count > *pCount) {
                    library_driver_handle_count = *pCount - total_driver_handle_count;
                }
                result = drv.dditable.zes.Driver.pfnGet( &library_driver_handle_count, &phDrivers[ total_driver_handle_count ] );
                if( ZE_RESULT_SUCCESS != result ) break;

                drv.driverInuse = true;

                try
                {
                    for( uint32_t i = 0; i < library_driver_handle_count; ++i ) {
                        uint32_t driver_index = total_driver_handle_count + i;
                        phDrivers[ driver_index ] = reinterpret_cast<zes_driver_handle_t>(
                            context->zes_driver_factory.getInstance( phDrivers[ driver_index ], &drv.dditable ) );
                    }
                }
                catch( std::bad_alloc& )
                {
                    result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
                }
            }

            total_driver_handle_count += library_driver_handle_count;
        }

        // If the last driver get failed, but at least one driver succeeded, then return success with total count.
        if( ZE_RESULT_SUCCESS == result || total_driver_handle_count > 0)
            *pCount = total_driver_handle_count;
        if (total_driver_handle_count > 0) {
            result = ZE_RESULT_SUCCESS;
        }

        return result;
    }